

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O1

void __thiscall rtosc::UndoHistoryImpl::replay(UndoHistoryImpl *this,char *msg)

{
  char *pcVar1;
  size_t sVar2;
  rtosc_arg_t rVar3;
  rtosc_arg_t arg;
  char *local_38;
  rtosc_arg_t local_30;
  
  local_30 = rtosc_argument(msg,2);
  rVar3 = rtosc_argument(msg,0);
  pcVar1 = rtosc_argument_string(msg);
  sVar2 = rtosc_amessage(tmp,0x100,rVar3.s,pcVar1 + 2,&local_30);
  if ((int)sVar2 != 0) {
    local_38 = tmp;
    if ((this->cb).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->cb)._M_invoker)((_Any_data *)&this->cb,&local_38);
  }
  return;
}

Assistant:

void UndoHistoryImpl::replay(const char *msg)
{
    rtosc_arg_t arg = rtosc_argument(msg,2);
    int len = rtosc_amessage(tmp, 256, rtosc_argument(msg,0).s,
            rtosc_argument_string(msg)+2,
            &arg);
    
    if(len)
        cb(tmp);
}